

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImplicitAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitAnsiPortSyntax,slang::syntax::ImplicitAnsiPortSyntax_const&>
          (BumpAllocator *this,ImplicitAnsiPortSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  DeclaratorSyntax *pDVar3;
  undefined4 uVar4;
  ImplicitAnsiPortSyntax *pIVar5;
  
  pIVar5 = (ImplicitAnsiPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitAnsiPortSyntax *)this->endPtr < pIVar5 + 1) {
    pIVar5 = (ImplicitAnsiPortSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pIVar5 + 1);
  }
  (pIVar5->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pIVar5->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar5->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pIVar5->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pIVar5->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar5->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pIVar5->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  pDVar3 = (args->declarator).ptr;
  (pIVar5->header).ptr = (args->header).ptr;
  (pIVar5->declarator).ptr = pDVar3;
  return pIVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }